

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

void __thiscall r_exec::View::delete_from_group(View *this)

{
  mutex *__mutex;
  Group *this_00;
  ushort uVar1;
  int iVar2;
  
  uVar1 = r_code::Atom::asIndex();
  this_00 = (Group *)(this->super_View).references[uVar1];
  __mutex = &this_00->mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    Group::delete_view(this_00,this);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void View::delete_from_group()
{
    Group *g = get_host();
    std::lock_guard<std::mutex> guard(g->mutex);
    g->delete_view(this);
}